

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O0

void __thiscall
gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::rcu_list
          (rcu_list<int,_std::mutex,_std::allocator<int>_> *this)

{
  rcu_list<int,_std::mutex,_std::allocator<int>_> *this_local;
  
  std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::atomic
            (&this->m_head,(__pointer_type)0x0);
  std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::atomic
            (&this->m_tail,(__pointer_type)0x0);
  std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::zombie_list_node_*>
  ::atomic(&this->m_zombie_head,(__pointer_type)0x0);
  std::mutex::mutex(&this->m_write_mutex);
  std::allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node>::allocator
            ((allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node> *)
             &this->field_0x40);
  std::
  allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::zombie_list_node>::
  allocator((allocator<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::zombie_list_node>
             *)&this->field_0x41);
  std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::store
            (&this->m_head,(__pointer_type)0x0,memory_order_seq_cst);
  std::atomic<gmlc::libguarded::rcu_list<int,_std::mutex,_std::allocator<int>_>::node_*>::store
            (&this->m_tail,(__pointer_type)0x0,memory_order_seq_cst);
  return;
}

Assistant:

rcu_list<T, M, Alloc>::rcu_list()
{
    m_head.store(nullptr);
    m_tail.store(nullptr);
}